

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

EraseResult __thiscall
QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
::erase(QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
        *this,const_iterator first,const_iterator last)

{
  _Rb_tree_header *__pos;
  iterator iVar1;
  _Rb_tree_node_base *p_Var2;
  EraseResult EVar3;
  
  EVar3.data = (QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
                *)operator_new(0x38);
  ((EVar3.data)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i = 0;
  __pos = &((EVar3.data)->m)._M_t._M_impl.super__Rb_tree_header;
  ((EVar3.data)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ((EVar3.data)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ((EVar3.data)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__pos->_M_header;
  ((EVar3.data)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__pos->_M_header;
  ((EVar3.data)->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (this->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1._M_node = &__pos->_M_header;
  for (; p_Var2 != first._M_node; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = std::
            _Rb_tree<QSettingsKey,std::pair<QSettingsKey_const,QVariant>,std::_Select1st<std::pair<QSettingsKey_const,QVariant>>,std::less<QSettingsKey>,std::allocator<std::pair<QSettingsKey_const,QVariant>>>
            ::_M_insert_unique_<std::pair<QSettingsKey_const,QVariant>const&>
                      ((_Rb_tree<QSettingsKey,std::pair<QSettingsKey_const,QVariant>,std::_Select1st<std::pair<QSettingsKey_const,QVariant>>,std::less<QSettingsKey>,std::allocator<std::pair<QSettingsKey_const,QVariant>>>
                        *)&(EVar3.data)->m,(const_iterator)__pos,
                       (pair<const_QSettingsKey,_QVariant> *)(p_Var2 + 1));
  }
  for (; p_Var2 != last._M_node; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
  }
  for (; (_Rb_tree_header *)p_Var2 != &(this->m)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<QSettingsKey,std::pair<QSettingsKey_const,QVariant>,std::_Select1st<std::pair<QSettingsKey_const,QVariant>>,std::less<QSettingsKey>,std::allocator<std::pair<QSettingsKey_const,QVariant>>>
    ::_M_insert_unique_<std::pair<QSettingsKey_const,QVariant>const&>
              ((_Rb_tree<QSettingsKey,std::pair<QSettingsKey_const,QVariant>,std::_Select1st<std::pair<QSettingsKey_const,QVariant>>,std::less<QSettingsKey>,std::allocator<std::pair<QSettingsKey_const,QVariant>>>
                *)&(EVar3.data)->m,(const_iterator)__pos,
               (pair<const_QSettingsKey,_QVariant> *)(p_Var2 + 1));
  }
  if ((_Rb_tree_header *)iVar1._M_node != __pos) {
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  }
  EVar3.it._M_node = iVar1._M_node;
  return EVar3;
}

Assistant:

EraseResult erase(const_iterator first, const_iterator last) const
    {
        EraseResult result;
        result.data = new QMapData;
        result.it = result.data->m.end();
        const auto newDataEnd = result.it;

        auto i = m.begin();
        const auto e = m.end();

        // copy over all the elements before first
        while (i != first) {
            result.it = result.data->m.insert(newDataEnd, *i);
            ++i;
        }

        // skip until last
        while (i != last)
            ++i;

        // copy from last to the end
        while (i != e) {
            result.data->m.insert(newDataEnd, *i);
            ++i;
        }

        if (result.it != newDataEnd)
            ++result.it;

        return result;
    }